

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_vfs_register(sqlite3_vfs *pVfs,int makeDflt)

{
  int iVar1;
  sqlite3_mutex *psVar2;
  sqlite3_vfs *psVar3;
  sqlite3_vfs **ppsVar4;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    if (sqlite3Config.bCoreMutex == 0) {
      psVar2 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar2 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    }
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar2);
    }
    vfsUnlink(pVfs);
    if (vfsList == (sqlite3_vfs *)0x0 || makeDflt != 0) {
      ppsVar4 = &vfsList;
      psVar3 = vfsList;
    }
    else {
      ppsVar4 = &vfsList->pNext;
      psVar3 = vfsList->pNext;
    }
    iVar1 = 0;
    pVfs->pNext = psVar3;
    *ppsVar4 = pVfs;
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar2);
    }
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_vfs_register(sqlite3_vfs *pVfs, int makeDflt){
  MUTEX_LOGIC(sqlite3_mutex *mutex;)
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pVfs==0 ) return SQLITE_MISUSE_BKPT;
#endif

  MUTEX_LOGIC( mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER); )
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  if( makeDflt || vfsList==0 ){
    pVfs->pNext = vfsList;
    vfsList = pVfs;
  }else{
    pVfs->pNext = vfsList->pNext;
    vfsList->pNext = pVfs;
  }
  assert(vfsList);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}